

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

void usage(void)

{
  printf(
        "Usage: glfwinfo [-h] [-a API] [-m MAJOR] [-n MINOR] [-d] [-l] [-f] [-p PROFILE] [-s STRATEGY] [-b BEHAVIOR]\n"
        );
  printf("Options:\n");
  printf("  -a the client API to use (gl or es)\n");
  printf("  -b the release behavior to use (none or flush)\n");
  printf("  -d request a debug context\n");
  printf("  -f require a forward-compatible context\n");
  printf("  -h show this help\n");
  printf("  -l list all client API extensions after context creation\n");
  printf("  -m the major number of the required client API version\n");
  printf("  -n the minor number of the required client API version\n");
  printf("  -p the OpenGL profile to use (core or compat)\n");
  printf("  -s the robustness strategy to use (none or lose)\n");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: glfwinfo [-h] [-a API] [-m MAJOR] [-n MINOR] [-d] [-l] [-f] [-p PROFILE] [-s STRATEGY] [-b BEHAVIOR]\n");
    printf("Options:\n");
    printf("  -a the client API to use (" API_OPENGL " or " API_OPENGL_ES ")\n");
    printf("  -b the release behavior to use (" BEHAVIOR_NAME_NONE " or " BEHAVIOR_NAME_FLUSH ")\n");
    printf("  -d request a debug context\n");
    printf("  -f require a forward-compatible context\n");
    printf("  -h show this help\n");
    printf("  -l list all client API extensions after context creation\n");
    printf("  -m the major number of the required client API version\n");
    printf("  -n the minor number of the required client API version\n");
    printf("  -p the OpenGL profile to use (" PROFILE_NAME_CORE " or " PROFILE_NAME_COMPAT ")\n");
    printf("  -s the robustness strategy to use (" STRATEGY_NAME_NONE " or " STRATEGY_NAME_LOSE ")\n");
}